

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jim.cpp
# Opt level: O3

void __thiscall ObserverManager_Jim_Test::~ObserverManager_Jim_Test(ObserverManager_Jim_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, Jim) {
    Worker* jim = new Worker();
    ObserverManager::subscribe<MoneyProtocol>(jim);

    ObserverManager::notify(&MoneyProtocol::add, 500);
    ObserverManager::notify(&MoneyProtocol::withdraw, 100, "SuperBurger");

    ObserverManager::unsubscribe(jim);

    delete jim;
}